

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcompelwithmem.h
# Opt level: O0

void __thiscall
TPZCompElWithMem<TPZInterfaceElement>::SetIntegrationRule
          (TPZCompElWithMem<TPZInterfaceElement> *this,int ord)

{
  int iVar1;
  TPZIntPoints *pTVar2;
  int64_t iVar3;
  TPZCompEl *in_RDI;
  int intrulepoints;
  TPZIntPoints *intrule;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  
  TPZCompEl::SetIntegrationRule(in_RDI,in_stack_ffffffffffffffcc);
  pTVar2 = TPZCompEl::GetIntegrationRule
                     ((TPZCompEl *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  iVar1 = (*pTVar2->_vptr_TPZIntPoints[3])();
  iVar3 = TPZVec<long>::size((TPZVec<long> *)&in_RDI[3].fMesh);
  if (iVar1 != iVar3) {
    (**(code **)(*(long *)in_RDI + 0x178))();
    (**(code **)(*(long *)in_RDI + 0x168))();
  }
  return;
}

Assistant:

inline void TPZCompElWithMem<TBASE>::SetIntegrationRule(int ord)
{
    TBASE::SetIntegrationRule(ord);
    // verify if the number of integration points changed
    const TPZIntPoints &intrule = TBASE::GetIntegrationRule();
    int intrulepoints = intrule.NPoints();
    if (intrulepoints != fIntPtIndices.size()) {
        SetFreeIntPtIndices();
        PrepareIntPtIndices();
    }
    
}